

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

StreamIn * prvTidyinitStreamIn(TidyDocImpl *doc,int encoding)

{
  StreamIn *in_00;
  tchar *ptVar1;
  StreamIn *in;
  int encoding_local;
  TidyDocImpl *doc_local;
  
  in_00 = (StreamIn *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x160);
  memset(in_00,0,0x160);
  in_00->curline = 1;
  in_00->curcol = 1;
  in_00->encoding = encoding;
  in_00->state = FSM_ASCII;
  in_00->doc = doc;
  in_00->bufsize = 5;
  in_00->allocator = doc->allocator;
  ptVar1 = (tchar *)(*doc->allocator->vtbl->alloc)(doc->allocator,(ulong)in_00->bufsize << 2);
  in_00->charbuf = ptVar1;
  InitLastPos(in_00);
  return in_00;
}

Assistant:

StreamIn* TY_(initStreamIn)( TidyDocImpl* doc, int encoding )
{
    StreamIn *in = (StreamIn*) TidyDocAlloc( doc, sizeof(StreamIn) );

    TidyClearMemory( in, sizeof(StreamIn) );
    in->curline = 1;
    in->curcol = 1;
    in->encoding = encoding;
    in->state = FSM_ASCII;
    in->doc = doc;
    in->bufsize = CHARBUF_SIZE;
    in->allocator = doc->allocator;
    in->charbuf = (tchar*)TidyDocAlloc(doc, sizeof(tchar) * in->bufsize);
    InitLastPos( in );
    return in;
}